

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_2_channels_with_1_coeff
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  
  pfVar1 = output_buffer + output_sub_size * 2;
  do {
    *(ulong *)output_buffer =
         CONCAT44((float)((ulong)*(undefined8 *)
                                  (decode_buffer + (long)horizontal_contributors->n0 * 2) >> 0x20) *
                  *horizontal_coefficients + 0.0,
                  (float)*(undefined8 *)(decode_buffer + (long)horizontal_contributors->n0 * 2) *
                  *horizontal_coefficients + 0.0);
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 2;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_1_coeff)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__1_coeff_only();
    stbir__store_output_tiny();
  } while ( output < output_end );
}